

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_TextureMapping::ON_TextureMapping(ON_TextureMapping *this,ON_TextureMapping *src)

{
  long lVar1;
  long lVar2;
  ON_Xform *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,TextureMapping,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00824fa0;
  this->m_type = no_mapping;
  this->m_projection = no_projection;
  *(undefined8 *)((long)&this->m_projection + 1) = 0;
  lVar2 = 0x10;
  pOVar3 = &ON_Xform::IdentityTransformation;
  pOVar4 = &this->m_Pxyz;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  pOVar3 = &ON_Xform::IdentityTransformation;
  pOVar4 = &this->m_Nxyz;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  pOVar3 = &ON_Xform::IdentityTransformation;
  pOVar4 = &this->m_uvw;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  (this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_TextureMapping::ON_TextureMapping( const ON_TextureMapping& src)
  : ON_ModelComponent(ON_ModelComponent::Type::TextureMapping,src)
{
  Internal_CopyFrom(src);
}